

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_builder.cc
# Opt level: O0

Slice __thiscall leveldb::BlockBuilder::Finish(BlockBuilder *this)

{
  long lVar1;
  Slice SVar2;
  size_type sVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  Slice *in_stack_ffffffffffffffb8;
  undefined8 local_28;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  while( true ) {
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (in_stack_ffffffffffffffa8);
    if (sVar3 <= local_28) break;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffffb8,
               (size_type)in_stack_ffffffffffffffb0);
    PutFixed32(in_stack_ffffffffffffffb0,(uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    local_28 = local_28 + 1;
  }
  this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
  PutFixed32(in_stack_ffffffffffffffb0,(uint32_t)((ulong)this_00 >> 0x20));
  *(undefined1 *)(in_RDI + 0x44) = 1;
  Slice::Slice(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    SVar2.size_ = local_10;
    SVar2.data_ = local_18;
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

Slice BlockBuilder::Finish() {
  // Append restart array
  for (size_t i = 0; i < restarts_.size(); i++) {
    PutFixed32(&buffer_, restarts_[i]);
  }
  PutFixed32(&buffer_, restarts_.size());
  finished_ = true;
  return Slice(buffer_);
}